

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsondocument.cpp
# Opt level: O3

QJsonDocument __thiscall
QJsonDocument::fromJson(QJsonDocument *this,QByteArray *json,QJsonParseError *error)

{
  char *json_00;
  _Head_base<0UL,_QJsonDocumentPrivate_*,_false> this_00;
  long in_FS_OFFSET;
  undefined1 local_78 [32];
  QExplicitlySharedDataPointer<QCborContainerPrivate> local_58 [2];
  undefined1 local_48 [24];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_58[0].d.ptr = (totally_ordered_wrapper<QCborContainerPrivate_*>)&DAT_aaaaaaaaaaaaaaaa;
  local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  json_00 = (json->d).ptr;
  if (json_00 == (char *)0x0) {
    json_00 = "";
  }
  QJsonPrivate::Parser::Parser((Parser *)local_78,json_00,(int)(json->d).size);
  (this->d)._M_t.
  super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>._M_t.
  super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
  super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl = (QJsonDocumentPrivate *)0x0;
  local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QJsonPrivate::Parser::parse((QCborValue *)local_48,(Parser *)local_78,error);
  if ((local_48._16_4_ | 0x20) == Map) {
    this_00._M_head_impl = (QJsonDocumentPrivate *)operator_new(0x18);
    ((this_00._M_head_impl)->value).n = 0;
    *(QCborContainerPrivate **)((long)&(this_00._M_head_impl)->value + 8) =
         (QCborContainerPrivate *)0x0;
    *(undefined8 *)((long)&(this_00._M_head_impl)->value + 0x10) = 0;
    *(Type *)((long)&(this_00._M_head_impl)->value + 0x10) = Undefined;
    (this->d)._M_t.
    super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>._M_t.
    super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
    super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl = this_00._M_head_impl;
    QCborValue::operator=((QCborValue *)this_00._M_head_impl,(QCborValue *)local_48);
  }
  else if (error != (QJsonParseError *)0x0 && local_48._16_4_ != Undefined) {
    error->offset = 0;
    error->error = IllegalValue;
  }
  if ((QCborContainerPrivate *)local_48._8_8_ != (QCborContainerPrivate *)0x0) {
    QCborValue::dispose((QCborValue *)local_48);
  }
  QExplicitlySharedDataPointer<QCborContainerPrivate>::~QExplicitlySharedDataPointer(local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>)
           (unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>)this;
  }
  __stack_chk_fail();
}

Assistant:

QJsonDocument QJsonDocument::fromJson(const QByteArray &json, QJsonParseError *error)
{
    QJsonPrivate::Parser parser(json.constData(), json.size());
    QJsonDocument result;
    const QCborValue val = parser.parse(error);
    if (val.isArray() || val.isMap()) {
        result.d = std::make_unique<QJsonDocumentPrivate>();
        result.d->value = val;
    } else if (!val.isUndefined() && error) {
        // parsed a valid string/number/bool/null,
        // but QJsonDocument only stores objects and arrays.
        error->error = QJsonParseError::IllegalValue;
        error->offset = 0;
    }
    return result;
}